

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBInvalidOffsetAlignmentTest *this,GLuint test_case_index
          )

{
  reference pvVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  testCase *test_case;
  stringstream stream;
  ostream local_198;
  uint local_1c;
  XFBInvalidOffsetAlignmentTest *pXStack_18;
  GLuint test_case_index_local;
  XFBInvalidOffsetAlignmentTest *this_local;
  
  local_1c = test_case_index;
  pXStack_18 = this;
  this_local = (XFBInvalidOffsetAlignmentTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&test_case);
  pvVar1 = std::
           vector<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)local_1c);
  poVar2 = std::operator<<(&local_198,"Stage: ");
  pGVar3 = Utils::Shader::GetStageName(pvVar1->m_stage);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2,", type: ");
  pGVar3 = Utils::Type::GetGLSLTypeName(&pvVar1->m_type);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2,", offset: ");
  std::ostream::operator<<(poVar2,pvVar1->m_offset);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&test_case);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBInvalidOffsetAlignmentTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << ", type: " << test_case.m_type.GetGLSLTypeName() << ", offset: " << test_case.m_offset;

	return stream.str();
}